

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O2

SUNLinearSolver SUNLinSol_PCG(N_Vector y,int pretype,int maxl,SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  SUNLinearSolver p_Var2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if ((uint)pretype < 4) {
    iVar5 = pretype;
  }
  iVar6 = 5;
  if (0 < maxl) {
    iVar6 = maxl;
  }
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNLinSolGetType_PCG;
  p_Var1->getid = SUNLinSolGetID_PCG;
  p_Var1->setatimes = SUNLinSolSetATimes_PCG;
  p_Var1->setpreconditioner = SUNLinSolSetPreconditioner_PCG;
  p_Var1->setscalingvectors = SUNLinSolSetScalingVectors_PCG;
  p_Var1->setzeroguess = SUNLinSolSetZeroGuess_PCG;
  p_Var1->initialize = SUNLinSolInitialize_PCG;
  p_Var1->setup = SUNLinSolSetup_PCG;
  p_Var1->solve = SUNLinSolSolve_PCG;
  p_Var1->numiters = SUNLinSolNumIters_PCG;
  p_Var1->resnorm = SUNLinSolResNorm_PCG;
  p_Var1->resid = SUNLinSolResid_PCG;
  p_Var1->lastflag = SUNLinSolLastFlag_PCG;
  p_Var1->space = SUNLinSolSpace_PCG;
  p_Var1->free = SUNLinSolFree_PCG;
  piVar3 = (int *)malloc(0x70);
  p_Var2->content = piVar3;
  piVar3[6] = 0;
  *piVar3 = iVar6;
  piVar3[1] = iVar5;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  piVar3[0x18] = 0;
  piVar3[0x19] = 0;
  piVar3[0x1a] = 0;
  piVar3[0x1b] = 0;
  piVar3[0x14] = 0;
  piVar3[0x15] = 0;
  piVar3[0x16] = 0;
  piVar3[0x17] = 0;
  piVar3[0x10] = 0;
  piVar3[0x11] = 0;
  piVar3[0x12] = 0;
  piVar3[0x13] = 0;
  piVar3[0xc] = 0;
  piVar3[0xd] = 0;
  piVar3[0xe] = 0;
  piVar3[0xf] = 0;
  piVar3[8] = 0;
  piVar3[9] = 0;
  piVar3[10] = 0;
  piVar3[0xb] = 0;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x14) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x16) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x18) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1a) = uVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_PCG(N_Vector y, int pretype, int maxl, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_PCG content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE) && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
  {
    pretype = SUN_PREC_NONE;
  }
  if (maxl <= 0) { maxl = SUNPCG_MAXL_DEFAULT; }

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_PCG;
  S->ops->getid             = SUNLinSolGetID_PCG;
  S->ops->setatimes         = SUNLinSolSetATimes_PCG;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_PCG;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_PCG;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_PCG;
  S->ops->initialize        = SUNLinSolInitialize_PCG;
  S->ops->setup             = SUNLinSolSetup_PCG;
  S->ops->solve             = SUNLinSolSolve_PCG;
  S->ops->numiters          = SUNLinSolNumIters_PCG;
  S->ops->resnorm           = SUNLinSolResNorm_PCG;
  S->ops->resid             = SUNLinSolResid_PCG;
  S->ops->lastflag          = SUNLinSolLastFlag_PCG;
  S->ops->space             = SUNLinSolSpace_PCG;
  S->ops->free              = SUNLinSolFree_PCG;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_PCG)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content  */
  S->content = content;

  /* Fill content */
  content->last_flag = 0;
  content->maxl      = maxl;
  content->pretype   = pretype;
  content->zeroguess = SUNFALSE;
  content->numiters  = 0;
  content->resnorm   = ZERO;
  content->r         = NULL;
  content->p         = NULL;
  content->z         = NULL;
  content->Ap        = NULL;
  content->s         = NULL;
  content->ATimes    = NULL;
  content->ATData    = NULL;
  content->Psetup    = NULL;
  content->Psolve    = NULL;
  content->PData     = NULL;

  /* Allocate content */
  content->r = N_VClone(y);
  SUNCheckLastErrNull();

  content->p = N_VClone(y);
  SUNCheckLastErrNull();

  content->z = N_VClone(y);
  SUNCheckLastErrNull();

  content->Ap = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}